

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O3

void __thiscall
glslang::TBuiltIns::addQueryFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  pointer *ppcVar5;
  uint uVar6;
  char *pcVar7;
  TString *pTVar8;
  bool bVar9;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *this_02;
  int iVar10;
  TString funcName [2];
  size_type *local_c0;
  pool_allocator<char> local_98;
  pool_allocator<char> local_90;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_88 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_60 [48];
  
  bVar4 = sampler._1_1_;
  if (((((uint)sampler >> 0x13 & 1) != 0) && (((uint)sampler & 0xff00) != 0x700)) &&
     (((uint)sampler & 0xff00) != 0x800)) {
    if (version < 0x136 && profile == EEsProfile) {
      return;
    }
    if (version < 0x1a4 && profile != EEsProfile) {
      return;
    }
  }
  iVar10 = (this->dimMap[bVar4] + (uint)(((uint)sampler >> 0x10 & 1) != 0)) - (uint)(bVar4 == 4);
  if (profile == EEsProfile) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,"highp ");
  }
  pTVar8 = &(this->super_TBuiltInParseables).commonBuiltins;
  if (iVar10 == 1) {
    pcVar7 = "int";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,"ivec");
    pcVar7 = this->postfixes[iVar10];
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (pTVar8,pcVar7);
  if (((((uint)sampler >> 0x13 & 1) == 0) || (((uint)sampler & 0xff00) == 0x700)) ||
     (((uint)sampler & 0xff00) == 0x800)) {
    pTVar8 = &(this->super_TBuiltInParseables).commonBuiltins;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8," textureSize(");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(pTVar8,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
    if (((uint)sampler >> 0x13 & 1) != 0) goto LAB_0048533d;
LAB_0048534f:
    if ((((uint)sampler & 0xff00) != 0x500) &&
       ((((uint)sampler & 0xff00) != 0x600 && (((uint)sampler >> 0x12 & 1) == 0)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&(this->super_TBuiltInParseables).commonBuiltins,",int);\n");
      bVar9 = 0x1ad < version && profile != EEsProfile;
      uVar6 = 0;
      goto LAB_00485452;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8," imageSize(readonly writeonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(pTVar8,(typeName->_M_dataplus)._M_p,typeName->_M_string_length);
LAB_0048533d:
    if ((((uint)sampler & 0xff00) == 0x800) || (((uint)sampler & 0xff00) == 0x700))
    goto LAB_0048534f;
  }
  local_c0 = &typeName->_M_string_length;
  pTVar8 = &(this->super_TBuiltInParseables).commonBuiltins;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (pTVar8,");\n");
  bVar9 = 0x1ad < version && profile != EEsProfile;
  uVar6 = (uint)sampler & 0x40000;
  if (((uint)sampler & 0x40000) != 0 && (0x1ad < version && profile != EEsProfile)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,"int ");
    pcVar7 = "imageSamples(readonly writeonly volatile coherent nontemporal ";
    if (((int)sampler - 0x700U & 0xffff) < 0x200) {
      pcVar7 = "textureSamples(";
    }
    if (((uint)sampler >> 0x13 & 1) == 0) {
      pcVar7 = "textureSamples(";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,pcVar7);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(pTVar8,(typeName->_M_dataplus)._M_p,*local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,");\n");
    uVar6 = 1;
  }
LAB_00485452:
  local_c0 = &typeName->_M_string_length;
  pTVar8 = &(this->super_TBuiltInParseables).commonBuiltins;
  ppcVar5 = &(typeName->_M_dataplus)._M_p;
  if ((((0x95 < version && profile != EEsProfile) && ((uint)sampler & 0x140000) == 0x100000) &&
      (((uint)sampler & 0xff00) != 0x500)) && (((uint)sampler & 0xff00) != 0x600)) {
    local_90.allocator = GetThreadPoolAllocator();
    this_02 = local_88;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(this_02,"vec2 textureQueryLod(",&local_90);
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>(local_60,"vec2 textureQueryLOD(",&local_98);
    this_00 = (this->super_TBuiltInParseables).stageBuiltins + 4;
    this_01 = (this->super_TBuiltInParseables).stageBuiltins + 5;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      bVar2 = true;
      do {
        bVar1 = bVar2;
        if ((bool)(((uint)sampler & 0xff) != 3 & (bVar1 ^ 1U))) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(this_00,*(char **)(this_02 + 8),*(size_type *)(this_02 + 0x10));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(this_00,*ppcVar5,*local_c0);
        if (this->dimMap[bVar4] == 1) {
          if (!bVar1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(this_00,", float16_t");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(this_00,");\n");
            break;
          }
          pcVar7 = ", float";
        }
        else {
          pcVar7 = ", f16vec";
          if (bVar1) {
            pcVar7 = ", vec";
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,pcVar7);
          pcVar7 = this->postfixes[this->dimMap[bVar4]];
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,pcVar7);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,");\n");
        bVar2 = false;
      } while (bVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_01,*(char **)(this_02 + 8),*(size_type *)(this_02 + 0x10));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_01,*ppcVar5,*local_c0);
      if (this->dimMap[bVar4] == 1) {
        pcVar7 = ", float";
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_01,", vec");
        pcVar7 = this->postfixes[this->dimMap[bVar4]];
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_01,pcVar7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_01,");\n");
      this_02 = local_60;
      bVar2 = false;
    } while (bVar3);
  }
  if ((bVar9) &&
     ((((((uint)sampler >> 0x13 & 1) == 0 || (((uint)sampler & 0xff00) == 0x800)) ||
       (((uint)sampler & 0xff00) == 0x700)) &&
      (((uVar6 == 0 && (((uint)sampler & 0xff00) != 0x500)) && (((uint)sampler & 0xff00) != 0x600)))
      ))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,"int textureQueryLevels(");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(pTVar8,*ppcVar5,*local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,");\n");
  }
  return;
}

Assistant:

void TBuiltIns::addQueryFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // textureSize() and imageSize()
    //

    int sizeDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0) - (sampler.dim == EsdCube ? 1 : 0);

    if (sampler.isImage() && ((profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 420)))
        return;

    if (profile == EEsProfile)
        commonBuiltins.append("highp ");
    if (sizeDims == 1)
        commonBuiltins.append("int");
    else {
        commonBuiltins.append("ivec");
        commonBuiltins.append(postfixes[sizeDims]);
    }
    if (sampler.isImage())
        commonBuiltins.append(" imageSize(readonly writeonly volatile coherent nontemporal ");
    else
        commonBuiltins.append(" textureSize(");
    commonBuiltins.append(typeName);
    if (! sampler.isImage() && ! sampler.isRect() && ! sampler.isBuffer() && ! sampler.isMultiSample())
        commonBuiltins.append(",int);\n");
    else
        commonBuiltins.append(");\n");

    //
    // textureSamples() and imageSamples()
    //

    // GL_ARB_shader_texture_image_samples
    // TODO: spec issue? there are no memory qualifiers; how to query a writeonly/readonly image, etc?
    if (profile != EEsProfile && version >= 430 && sampler.isMultiSample()) {
        commonBuiltins.append("int ");
        if (sampler.isImage())
            commonBuiltins.append("imageSamples(readonly writeonly volatile coherent nontemporal ");
        else
            commonBuiltins.append("textureSamples(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }

    //
    // textureQueryLod(), fragment stage only
    // Also enabled with extension GL_ARB_texture_query_lod
    // Extension GL_ARB_texture_query_lod says that textureQueryLOD() also exist at extension.

    if (profile != EEsProfile && version >= 150 && sampler.isCombined() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {

        const TString funcName[2] = {"vec2 textureQueryLod(", "vec2 textureQueryLOD("};

        for (int i = 0; i < 2; ++i){
            for (int f16TexAddr = 0; f16TexAddr < 2; ++f16TexAddr) {
                if (f16TexAddr && sampler.type != EbtFloat16)
                    continue;
                stageBuiltins[EShLangFragment].append(funcName[i]);
                stageBuiltins[EShLangFragment].append(typeName);
                if (dimMap[sampler.dim] == 1)
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", float16_t");
                    else
                        stageBuiltins[EShLangFragment].append(", float");
                else {
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", f16vec");
                    else
                        stageBuiltins[EShLangFragment].append(", vec");
                    stageBuiltins[EShLangFragment].append(postfixes[dimMap[sampler.dim]]);
                }
                stageBuiltins[EShLangFragment].append(");\n");
            }

            stageBuiltins[EShLangCompute].append(funcName[i]);
            stageBuiltins[EShLangCompute].append(typeName);
            if (dimMap[sampler.dim] == 1)
                stageBuiltins[EShLangCompute].append(", float");
            else {
                stageBuiltins[EShLangCompute].append(", vec");
                stageBuiltins[EShLangCompute].append(postfixes[dimMap[sampler.dim]]);
            }
            stageBuiltins[EShLangCompute].append(");\n");
        }
    }

    //
    // textureQueryLevels()
    //

    if (profile != EEsProfile && version >= 430 && ! sampler.isImage() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {
        commonBuiltins.append("int textureQueryLevels(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }
}